

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

OneofOptions * __thiscall
google::protobuf::OneofDescriptorProto::_internal_mutable_options(OneofDescriptorProto *this)

{
  OneofOptions *pOVar1;
  Arena *arena;
  
  pOVar1 = (this->field_0)._impl_.options_;
  if (pOVar1 != (OneofOptions *)0x0) {
    return pOVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pOVar1 = (OneofOptions *)Arena::DefaultConstruct<google::protobuf::OneofOptions>(arena);
  (this->field_0)._impl_.options_ = pOVar1;
  return pOVar1;
}

Assistant:

inline ::google::protobuf::OneofOptions* PROTOBUF_NONNULL OneofDescriptorProto::_internal_mutable_options() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.options_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::google::protobuf::OneofOptions>(GetArena());
    _impl_.options_ = reinterpret_cast<::google::protobuf::OneofOptions*>(p);
  }
  return _impl_.options_;
}